

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalHashAggregate::CombineDistinct
          (PhysicalHashAggregate *this,ExecutionContext *context,OperatorSinkCombineInput *input)

{
  GlobalSinkState *pGVar1;
  LocalSinkState *pLVar2;
  pointer puVar3;
  pointer puVar4;
  reference pvVar5;
  reference pvVar6;
  const_reference pvVar7;
  pointer pDVar8;
  reference pvVar9;
  type this_00;
  pointer pDVar10;
  reference this_01;
  type gstate_p;
  reference this_02;
  type lstate_p;
  ulong __n;
  unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
  *this_03;
  idx_t table_idx;
  size_type __n_00;
  
  if ((this->distinct_collection_info).
      super_unique_ptr<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::DistinctAggregateCollectionInfo,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::DistinctAggregateCollectionInfo_*,_std::default_delete<duckdb::DistinctAggregateCollectionInfo>_>
      .super__Head_base<0UL,_duckdb::DistinctAggregateCollectionInfo_*,_false>._M_head_impl !=
      (DistinctAggregateCollectionInfo *)0x0) {
    pGVar1 = input->global_state;
    pLVar2 = input->local_state;
    for (__n = 0; __n < (ulong)(((long)(this->groupings).
                                       super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                       .
                                       super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->groupings).
                                      super_vector<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                      .
                                      super__Vector_base<duckdb::HashAggregateGroupingData,_std::allocator<duckdb::HashAggregateGroupingData>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x70);
        __n = __n + 1) {
      pvVar5 = vector<duckdb::HashAggregateGroupingGlobalState,_true>::get<true>
                         ((vector<duckdb::HashAggregateGroupingGlobalState,_true> *)(pGVar1 + 1),__n
                         );
      pvVar6 = vector<duckdb::HashAggregateGroupingLocalState,_true>::get<true>
                         ((vector<duckdb::HashAggregateGroupingLocalState,_true> *)
                          &pLVar2[2].partition_info.min_batch_index,__n);
      pvVar7 = vector<duckdb::HashAggregateGroupingData,_true>::get<true>(&this->groupings,__n);
      this_03 = &pvVar7->distinct_data;
      pDVar8 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
               ::operator->(this_03);
      puVar3 = (pDVar8->radix_tables).
               super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar4 = (pDVar8->radix_tables).
               super_vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (__n_00 = 0; (long)puVar3 - (long)puVar4 >> 3 != __n_00; __n_00 = __n_00 + 1) {
        pDVar8 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
                 ::operator->(this_03);
        pvVar9 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                 ::get<true>(&pDVar8->radix_tables,__n_00);
        if ((pvVar9->
            super_unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::RadixPartitionedHashTable_*,_std::default_delete<duckdb::RadixPartitionedHashTable>_>
            .super__Head_base<0UL,_duckdb::RadixPartitionedHashTable_*,_false>._M_head_impl !=
            (RadixPartitionedHashTable *)0x0) {
          pDVar8 = unique_ptr<duckdb::DistinctAggregateData,_std::default_delete<duckdb::DistinctAggregateData>,_true>
                   ::operator->(this_03);
          pvVar9 = vector<duckdb::unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>,_true>
                   ::get<true>(&pDVar8->radix_tables,__n_00);
          this_00 = unique_ptr<duckdb::RadixPartitionedHashTable,_std::default_delete<duckdb::RadixPartitionedHashTable>,_true>
                    ::operator*(pvVar9);
          pDVar10 = unique_ptr<duckdb::DistinctAggregateState,_std::default_delete<duckdb::DistinctAggregateState>,_true>
                    ::operator->(&pvVar5->distinct_state);
          this_01 = vector<duckdb::unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>,_true>
                    ::get<true>(&pDVar10->radix_states,__n_00);
          gstate_p = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>
                     ::operator*(this_01);
          this_02 = vector<duckdb::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>,_true>
                    ::get<true>(&pvVar6->distinct_states,__n_00);
          lstate_p = unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>
                     ::operator*(this_02);
          RadixPartitionedHashTable::Combine(this_00,context,gstate_p,lstate_p);
        }
      }
    }
  }
  return;
}

Assistant:

void PhysicalHashAggregate::CombineDistinct(ExecutionContext &context, OperatorSinkCombineInput &input) const {

	auto &global_sink = input.global_state.Cast<HashAggregateGlobalSinkState>();
	auto &sink = input.local_state.Cast<HashAggregateLocalSinkState>();

	if (!distinct_collection_info) {
		return;
	}
	for (idx_t i = 0; i < groupings.size(); i++) {
		auto &grouping_gstate = global_sink.grouping_states[i];
		auto &grouping_lstate = sink.grouping_states[i];

		auto &distinct_data = groupings[i].distinct_data;
		auto &distinct_state = grouping_gstate.distinct_state;

		const auto table_count = distinct_data->radix_tables.size();
		for (idx_t table_idx = 0; table_idx < table_count; table_idx++) {
			if (!distinct_data->radix_tables[table_idx]) {
				continue;
			}
			auto &radix_table = *distinct_data->radix_tables[table_idx];
			auto &radix_global_sink = *distinct_state->radix_states[table_idx];
			auto &radix_local_sink = *grouping_lstate.distinct_states[table_idx];

			radix_table.Combine(context, radix_global_sink, radix_local_sink);
		}
	}
}